

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsg_unittest.cc
# Opt level: O2

AssertionResult __thiscall
anon_unknown.dwarf_19b63::IsEqual
          (anon_unknown_dwarf_19b63 *this,void *vec_a,void *vec_b,size_t size)

{
  int iVar1;
  AssertionResult *pAVar2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  ulong uVar3;
  size_t size_00;
  ulong uVar4;
  ulong uVar5;
  AssertionResult AVar6;
  long local_200;
  long local_1f8;
  AssertionResult local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream out;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  uVar4 = 4;
  local_1f8 = 0;
  uVar5 = 0;
  local_200 = 0;
  while( true ) {
    uVar3 = uVar4;
    if (size < uVar4) {
      uVar3 = size;
    }
    if (size <= uVar5) break;
    std::operator<<((ostream *)&out,"  ");
    size_00 = uVar3 + local_1f8;
    PrintWord((uint8_t *)((long)vec_a + uVar5),size_00,(ostream *)&out);
    iVar1 = bcmp((uint8_t *)((long)vec_a + uVar5),(uint8_t *)((long)vec_b + uVar5),size_00);
    if (iVar1 == 0) {
      std::operator<<((ostream *)&out,"   ");
    }
    else {
      std::operator<<((ostream *)&out," ! ");
      local_200 = local_200 + 1;
    }
    PrintWord((uint8_t *)((long)vec_b + uVar5),size_00,(ostream *)&out);
    uVar4 = uVar4 + 4;
    local_1f8 = local_1f8 + -4;
    uVar5 = uVar5 + 4;
    std::operator<<((ostream *)&out,"\n");
  }
  if (local_200 == 0) {
    testing::AssertionSuccess();
  }
  else {
    testing::AssertionFailure();
    pAVar2 = testing::AssertionResult::operator<<
                       (&local_1d8,(char (*) [23])"A and B aren\'t equal:\n");
    std::__cxx11::stringbuf::str();
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,&local_1c8);
    testing::AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
    std::__cxx11::string::~string((string *)&local_1c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&local_1d8.message_);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  AVar6.message_.ptr_ = extraout_RDX.ptr_;
  AVar6._0_8_ = this;
  return AVar6;
}

Assistant:

::testing::AssertionResult IsEqual(const void *vec_a, const void *vec_b,
                                   size_t size) {
  std::ostringstream out;
  const uint8_t *a = reinterpret_cast<const uint8_t*>(vec_a);
  const uint8_t *b = reinterpret_cast<const uint8_t*>(vec_b);
  size_t i, errors = 0;
  for (i = 0; i < size; i += 4) {
    size_t len = 4;
    if (i + len > size)
      len = size - i;
    out << "  ";
    PrintWord(a+i, len, out);
    if (memcmp(a+i, b+i, len) == 0) {
      out << "   ";
    } else {
      out << " ! ";
      ++errors;
    }
    PrintWord(b+i, len, out);
    out << "\n";
  }
  if (!errors)
    return ::testing::AssertionSuccess();
  else
    return ::testing::AssertionFailure()
        << "A and B aren't equal:\n"
        << out.str();
}